

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::DisplayGraph(cmComputeTargetDepends *this,Graph *graph,string *name)

{
  FILE *pFVar1;
  bool bVar2;
  undefined8 uVar3;
  EdgeList *pEVar4;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_00;
  reference ppcVar5;
  reference this_01;
  size_t __n;
  char *pcVar6;
  cmGeneratorTarget *dependee;
  size_t dependee_index;
  cmGraphEdge *ni;
  const_iterator __end2;
  const_iterator __begin2;
  EdgeList *__range2;
  cmGeneratorTarget *depender;
  EdgeList *nl;
  size_t depender_index;
  size_t n;
  string *name_local;
  Graph *graph_local;
  cmComputeTargetDepends *this_local;
  
  pFVar1 = _stderr;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"The %s target dependency graph is:\n",uVar3);
  pEVar4 = (EdgeList *)
           std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::size
                     (&graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  for (nl = (EdgeList *)0x0; nl < pEVar4;
      nl = (EdgeList *)
           ((long)&(nl->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>._M_impl.
                   super__Vector_impl_data._M_start + 1)) {
    this_00 = &std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                         (&graph->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                          (size_type)nl)->super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
    ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
              operator[](&this->Targets,(size_type)nl);
    pFVar1 = _stderr;
    cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar5);
    uVar3 = std::__cxx11::string::c_str();
    fprintf(pFVar1,"target %zu is [%s]\n",nl,uVar3);
    __end2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::begin(this_00);
    ni = (cmGraphEdge *)std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                                  *)&ni);
      if (!bVar2) break;
      this_01 = __gnu_cxx::
                __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
                ::operator*(&__end2);
      __n = cmGraphEdge::operator_cast_to_unsigned_long(this_01);
      ppcVar5 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
                operator[](&this->Targets,__n);
      pFVar1 = _stderr;
      cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar5);
      uVar3 = std::__cxx11::string::c_str();
      bVar2 = cmGraphEdge::IsStrong(this_01);
      pcVar6 = "weak";
      if (bVar2) {
        pcVar6 = "strong";
      }
      fprintf(pFVar1,"  depends on target %zu [%s] (%s)\n",__n,uVar3,pcVar6);
      __gnu_cxx::
      __normal_iterator<const_cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
      ::operator++(&__end2);
    }
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void cmComputeTargetDepends::DisplayGraph(Graph const& graph,
                                          const std::string& name)
{
  fprintf(stderr, "The %s target dependency graph is:\n", name.c_str());
  size_t n = graph.size();
  for (size_t depender_index = 0; depender_index < n; ++depender_index) {
    EdgeList const& nl = graph[depender_index];
    cmGeneratorTarget const* depender = this->Targets[depender_index];
    fprintf(stderr, "target %zu is [%s]\n", depender_index,
            depender->GetName().c_str());
    for (cmGraphEdge const& ni : nl) {
      size_t dependee_index = ni;
      cmGeneratorTarget const* dependee = this->Targets[dependee_index];
      fprintf(stderr, "  depends on target %zu [%s] (%s)\n", dependee_index,
              dependee->GetName().c_str(), ni.IsStrong() ? "strong" : "weak");
    }
  }
  fprintf(stderr, "\n");
}